

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph-opt.cpp
# Opt level: O1

void buildJobs(Options *Opts,ParseResult *Result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pbVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  char cVar7;
  int iVar8;
  size_t sVar9;
  OptionValue *pOVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  long lVar12;
  char *In;
  const_iterator cVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar14;
  ostream *poVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *S;
  pointer pbVar16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string TgtLang;
  string OutTgtSrc;
  Parser parser;
  ofstream OutTgtFileStream;
  ifstream InPhFileStream;
  string local_4b8;
  char *local_498;
  long local_490;
  char local_488 [16];
  Parser local_478;
  string local_458;
  undefined1 local_438 [8];
  size_type local_430;
  char local_428 [232];
  ios_base local_340 [264];
  string local_238;
  undefined1 *local_218 [2];
  undefined1 local_208 [472];
  
  paVar1 = &local_238.field_2;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"help","");
  sVar9 = cxxopts::ParseResult::count(Result,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if (sVar9 != 0) {
    local_238._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
    local_218[0] = local_208;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"Group","");
    __l._M_len = 2;
    __l._M_array = &local_238;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_4b8,__l,(allocator_type *)&local_498);
    cxxopts::Options::help
              ((string *)local_438,Opts,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_4b8);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_438,local_430);
    std::endl<char,std::char_traits<char>>(poVar15);
    if (local_438 != (undefined1  [8])local_428) {
      operator_delete((void *)local_438);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_4b8);
    lVar12 = 0;
    do {
      if (local_208 + lVar12 != *(undefined1 **)((long)local_218 + lVar12)) {
        operator_delete(*(undefined1 **)((long)local_218 + lVar12));
      }
      lVar12 = lVar12 + -0x20;
    } while (lVar12 != -0x40);
    exit(0);
  }
  std::ifstream::ifstream(&local_238);
  local_438 = (undefined1  [8])local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"input","");
  sVar9 = cxxopts::ParseResult::count(Result,(string *)local_438);
  if (local_438 != (undefined1  [8])local_428) {
    operator_delete((void *)local_438);
  }
  if (sVar9 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ph-opt",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\x1b[31m error: \x1b[0m",0x11);
    std::operator<<((ostream *)&std::cerr,"No input files! Usage see option \'--help\'.\n");
  }
  else {
    paVar1 = &local_4b8.field_2;
    local_4b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"input","");
    pOVar10 = cxxopts::ParseResult::operator[](Result,&local_4b8);
    pbVar11 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar10);
    pcVar3 = (pbVar11->_M_dataplus)._M_p;
    local_438 = (undefined1  [8])local_428;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_438,pcVar3,pcVar3 + pbVar11->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_4b8._M_dataplus._M_p);
    }
    std::ifstream::open((string *)&local_238,(_Ios_Openmode)local_438);
    cVar7 = std::__basic_file<char>::is_open();
    if (cVar7 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ph-opt",6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\x1b[31m error: \x1b[0m",0x11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail to open ",0xd);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(char *)local_438,local_430);
      std::operator<<(poVar15,'\n');
    }
    else {
      paVar2 = &local_238.field_2;
      lVar12 = (**(code **)(local_238.field_2._M_allocated_capacity + 0x20))(paVar2,0,2,8);
      (**(code **)(local_238.field_2._M_allocated_capacity + 0x28))(paVar2,0,0,8);
      In = (char *)operator_new__(lVar12 + 1);
      (**(code **)(local_238.field_2._M_allocated_capacity + 0x40))(paVar2,In,lVar12);
      In[lVar12] = '\0';
      std::ifstream::close();
      if (local_438 != (undefined1  [8])local_428) {
        operator_delete((void *)local_438);
      }
      local_4b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"");
      local_438 = (undefined1  [8])local_428;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"lang","");
      sVar9 = cxxopts::ParseResult::count(Result,(string *)local_438);
      if (local_438 != (undefined1  [8])local_428) {
        operator_delete((void *)local_438);
      }
      if (sVar9 == 0) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_4b8,0,(char *)local_4b8._M_string_length,0x1452cc);
      }
      else {
        local_438 = (undefined1  [8])local_428;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"lang","");
        pOVar10 = cxxopts::ParseResult::operator[](Result,(string *)local_438);
        cxxopts::OptionValue::as<std::__cxx11::string>(pOVar10);
        std::__cxx11::string::_M_assign((string *)&local_4b8);
        if (local_438 != (undefined1  [8])local_428) {
          operator_delete((void *)local_438);
        }
        sVar6 = local_4b8._M_string_length;
        _Var5._M_p = local_4b8._M_dataplus._M_p;
        if ((char *)local_4b8._M_string_length != (char *)0x0) {
          lVar12 = 0;
          do {
            iVar8 = toupper((uint)(byte)_Var5._M_p[lVar12]);
            _Var5._M_p[lVar12] = (char)iVar8;
            lVar12 = lVar12 + 1;
          } while (sVar6 != lVar12);
        }
        cVar13 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&VALID_TARGET_LANG_abi_cxx11_._M_t,&local_4b8);
        if ((_Rb_tree_header *)cVar13._M_node ==
            &VALID_TARGET_LANG_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ph-opt",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"\x1b[31m error: \x1b[0m",0x11);
          std::operator<<((ostream *)&std::cerr,
                          "Unknown target language! Now only support \'Numpy, OpenMP, OpenCL, Cuda, Bang, CCE, TPU\'.\n"
                         );
          goto LAB_0010ec16;
        }
      }
      _Var5._M_p = local_4b8._M_dataplus._M_p;
      if ((char *)local_4b8._M_string_length != (char *)0x0) {
        lVar12 = 0;
        do {
          iVar8 = toupper((uint)(byte)_Var5._M_p[lVar12]);
          _Var5._M_p[lVar12] = (char)iVar8;
          lVar12 = lVar12 + 1;
        } while (local_4b8._M_string_length != lVar12);
      }
      local_498 = local_488;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"");
      local_438 = (undefined1  [8])local_428;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"output","");
      sVar9 = cxxopts::ParseResult::count(Result,(string *)local_438);
      if (local_438 != (undefined1  [8])local_428) {
        operator_delete((void *)local_438);
      }
      if (sVar9 == 0) {
        getDefaultOutputFileName((string *)local_438,&local_4b8);
        std::__cxx11::string::operator=((string *)&local_498,(string *)local_438);
      }
      else {
        local_438 = (undefined1  [8])local_428;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"output","");
        pOVar10 = cxxopts::ParseResult::operator[](Result,(string *)local_438);
        cxxopts::OptionValue::as<std::__cxx11::string>(pOVar10);
        std::__cxx11::string::_M_assign((string *)&local_498);
      }
      if (local_438 != (undefined1  [8])local_428) {
        operator_delete((void *)local_438);
      }
      local_438 = (undefined1  [8])local_428;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"positional","");
      sVar9 = cxxopts::ParseResult::count(Result,(string *)local_438);
      if (local_438 != (undefined1  [8])local_428) {
        operator_delete((void *)local_438);
      }
      if (sVar9 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Positional = {",0xe);
        local_438 = (undefined1  [8])local_428;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"positional","");
        pOVar10 = cxxopts::ParseResult::operator[](Result,(string *)local_438);
        pvVar14 = cxxopts::OptionValue::
                  as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            (pOVar10);
        if (local_438 != (undefined1  [8])local_428) {
          operator_delete((void *)local_438);
        }
        pbVar4 = (pvVar14->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar16 = (pvVar14->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar16 != pbVar4;
            pbVar16 = pbVar16 + 1) {
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(pbVar16->_M_dataplus)._M_p,
                               pbVar16->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,", ",2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}",1);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
        std::ostream::put(-0x40);
        std::ostream::flush();
      }
      phaeton::Lexer::Lexer(&local_478.PhaetonLexer,In);
      iVar8 = phaeton::Parser::parse(&local_478);
      if (iVar8 == 0) {
        operator_delete__(In);
        std::ofstream::ofstream(local_438,(string *)&local_498,_S_out);
        cVar7 = std::__basic_file<char>::is_open();
        if (cVar7 != '\0') {
          getTargetLanguageCode(&local_458,&local_478,&local_4b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_438,local_458._M_dataplus._M_p,local_458._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            operator_delete(local_458._M_dataplus._M_p);
          }
          std::ofstream::close();
          phaeton::Program::_delete(local_478.AST);
          (*((local_478.AST)->super_ASTNode)._vptr_ASTNode[4])(local_478.AST);
          local_438 = (undefined1  [8])_VTT;
          *(undefined8 *)(local_438 + *(long *)(_VTT + -0x18)) = _stdin;
          std::filebuf::~filebuf((filebuf *)&local_430);
          std::ios_base::~ios_base(local_340);
          phaeton::Lexer::~Lexer(&local_478.PhaetonLexer);
          if (local_498 != local_488) {
            operator_delete(local_498);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
            operator_delete(local_4b8._M_dataplus._M_p);
          }
          std::ifstream::~ifstream(&local_238);
          return;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ph-opt",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\x1b[31m error: \x1b[0m",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Fail to open file ",0x12);
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,local_498,local_490);
        std::operator<<(poVar15,'\n');
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ph-opt",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\x1b[31m error: \x1b[0m",0x11);
        std::operator<<((ostream *)&std::cerr,"Fail to parse input Phaeton tokens\n");
      }
    }
  }
LAB_0010ec16:
  exit(-1);
}

Assistant:

void buildJobs(const Options &Opts, const ParseResult &Result) {
  // Dump the help text message
  if (Result.count("help")) {
    std::cout << Opts.help({"", "Group"}) << std::endl;
    exit(EXIT_SUCCESS);
  }

  std::ifstream InPhFileStream;
  char *InPhTokens = NULL;

  // If we get here, that means, we don't pass the 'help' option,
  // so the user must have at least one input.
  if (Result.count("input")) {
    std::string PhSrcFile = Result["input"].as<std::string>();
    InPhFileStream.open(PhSrcFile);
    // Fail to open input source file.
    if (!InPhFileStream.is_open()) {
      std::cerr << PH_OPTIMIZER_EXE << ":" << FRED(" error: ")
                << "Fail to open " << PhSrcFile << '\n';
      exit(-1);
    }
    std::filebuf *FileBuf = InPhFileStream.rdbuf();
    std::size_t Size =
        FileBuf->pubseekoff(0, InPhFileStream.end, InPhFileStream.in);
    FileBuf->pubseekpos(0, InPhFileStream.in);

    InPhTokens = new char[Size + 1];
    FileBuf->sgetn(InPhTokens, Size);
    InPhTokens[Size] = 0;
    InPhFileStream.close();
  } else {
    std::cerr << PH_OPTIMIZER_EXE << ":" << FRED(" error: ")
              << "No input files! Usage see option '--help'.\n";
    exit(-1);
  }

  // Then we need to determine the final phase.

  std::string TgtLang = "";
  // If we get here, that means we need to translate Phaeton into target
  // language.
  if (Result.count("lang")) {
    TgtLang = Result["lang"].as<std::string>();
    // Uniform use of upper case
    toUpperCase(TgtLang);
    if (!VALID_TARGET_LANG.count(TgtLang)) {
      std::cerr << PH_OPTIMIZER_EXE << ":" << FRED(" error: ")
                << "Unknown target language! Now only support 'Numpy, OpenMP, "
                   "OpenCL, Cuda, Bang, CCE, TPU'.\n";
      exit(-1);
    }
  } else {
    // Default target language is OpenMP
    TgtLang = "OpenMP";
  }
  // Uniform use of upper case
  toUpperCase(TgtLang);

  std::string OutTgtSrc = "";
  // If we get here, that means we have already get the target language.
  if (Result.count("output")) {
    OutTgtSrc = Result["output"].as<std::string>();
  } else {
    // Default output name.
    OutTgtSrc = getDefaultOutputFileName(TgtLang);
  }

  if (Result.count("positional")) {
    std::cout << "Positional = {";
    auto &V = Result["positional"].as<std::vector<std::string>>();
    for (const auto &S : V) {
      std::cout << S << ", ";
    }
    std::cout << "}" << std::endl;
  }

  // If we get here, that means we have to perform translation to
  // translate Phaeton input source file into the target language
  // output.
  Parser parser(InPhTokens);
  if (parser.parse()) {
    std::cerr << PH_OPTIMIZER_EXE << ":" << FRED(" error: ")
              << "Fail to parse input Phaeton tokens\n";
    exit(-1);
  }
  // parser.getAST()->dump();
  delete[] InPhTokens;

  std::ofstream OutTgtFileStream(OutTgtSrc);
  if (OutTgtFileStream.is_open()) {
    OutTgtFileStream << getTargetLanguageCode(parser, TgtLang);
    OutTgtFileStream.close();
  } else {
    std::cerr << PH_OPTIMIZER_EXE << ":" << FRED(" error: ")
              << "Fail to open file " << OutTgtSrc << '\n';
    exit(-1);
  }
  Program::destroy(parser.getAST());
}